

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O1

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  
  iVar1 = 0;
  if ((bufs->cur->buf).end == (bufs->cur->buf).last) {
    iVar1 = bufs_alloc_chain(bufs);
  }
  if (iVar1 == 0) {
    *(bufs->cur->buf).last = b;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last = b;

  return 0;
}